

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFObjectHandle.cc
# Opt level: O3

string * __thiscall
QPDFObject::getStringValue_abi_cxx11_(string *__return_storage_ptr__,QPDFObject *this)

{
  __index_type _Var1;
  pointer pcVar2;
  variant_alternative_t<15UL,_variant<monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>_>
  *pvVar3;
  variant_alternative_t<7UL,_variant<monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>_>
  *pvVar4;
  logic_error *this_00;
  
  do {
    _Var1 = *(__index_type *)
             ((long)&(this->value).
                     super__Variant_base<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
                     .
                     super__Move_assign_alias<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
                     .
                     super__Copy_assign_alias<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
                     .
                     super__Move_ctor_alias<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
                     .
                     super__Copy_ctor_alias<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
                     .
                     super__Variant_storage_alias<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
             + 0x30);
    if (_Var1 == '\x0f') {
      pvVar3 = std::
               get<15ul,std::monostate,QPDF_Reserved,QPDF_Null,QPDF_Bool,QPDF_Integer,QPDF_Real,QPDF_String,QPDF_Name,QPDF_Array,QPDF_Dictionary,QPDF_Stream,QPDF_Operator,QPDF_InlineImage,QPDF_Unresolved,QPDF_Destroyed,QPDF_Reference>
                         (&this->value);
LAB_001c63ca:
      _Var1 = *(__index_type *)
               ((long)&(((pvVar3->obj).super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
                        _M_ptr)->value).
                       super__Variant_base<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
                       .
                       super__Move_assign_alias<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
                       .
                       super__Copy_assign_alias<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
                       .
                       super__Move_ctor_alias<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
               + 0x30);
    }
    else if (_Var1 == '\r') {
      pvVar3 = (variant_alternative_t<15UL,_variant<monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>_>
                *)QPDF::resolve(this->qpdf,this->og);
      goto LAB_001c63ca;
    }
    if (_Var1 != '\x0f') {
      switch(_Var1) {
      case '\x05':
        pvVar4 = (variant_alternative_t<7UL,_variant<monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>_>
                  *)std::
                    get<5ul,std::monostate,QPDF_Reserved,QPDF_Null,QPDF_Bool,QPDF_Integer,QPDF_Real,QPDF_String,QPDF_Name,QPDF_Array,QPDF_Dictionary,QPDF_Stream,QPDF_Operator,QPDF_InlineImage,QPDF_Unresolved,QPDF_Destroyed,QPDF_Reference>
                              (&this->value);
        break;
      case '\x06':
        pvVar4 = (variant_alternative_t<7UL,_variant<monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>_>
                  *)std::
                    get<6ul,std::monostate,QPDF_Reserved,QPDF_Null,QPDF_Bool,QPDF_Integer,QPDF_Real,QPDF_String,QPDF_Name,QPDF_Array,QPDF_Dictionary,QPDF_Stream,QPDF_Operator,QPDF_InlineImage,QPDF_Unresolved,QPDF_Destroyed,QPDF_Reference>
                              (&this->value);
        break;
      case '\a':
        pvVar4 = std::
                 get<7ul,std::monostate,QPDF_Reserved,QPDF_Null,QPDF_Bool,QPDF_Integer,QPDF_Real,QPDF_String,QPDF_Name,QPDF_Array,QPDF_Dictionary,QPDF_Stream,QPDF_Operator,QPDF_InlineImage,QPDF_Unresolved,QPDF_Destroyed,QPDF_Reference>
                           (&this->value);
        break;
      default:
        this_00 = (logic_error *)__cxa_allocate_exception(0x10);
        std::logic_error::logic_error(this_00,"Internal error in QPDFObject::getStringValue");
        __cxa_throw(this_00,&std::logic_error::typeinfo,std::logic_error::~logic_error);
      case '\v':
        pvVar4 = (variant_alternative_t<7UL,_variant<monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>_>
                  *)std::
                    get<11ul,std::monostate,QPDF_Reserved,QPDF_Null,QPDF_Bool,QPDF_Integer,QPDF_Real,QPDF_String,QPDF_Name,QPDF_Array,QPDF_Dictionary,QPDF_Stream,QPDF_Operator,QPDF_InlineImage,QPDF_Unresolved,QPDF_Destroyed,QPDF_Reference>
                              (&this->value);
        break;
      case '\f':
        pvVar4 = (variant_alternative_t<7UL,_variant<monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>_>
                  *)std::
                    get<12ul,std::monostate,QPDF_Reserved,QPDF_Null,QPDF_Bool,QPDF_Integer,QPDF_Real,QPDF_String,QPDF_Name,QPDF_Array,QPDF_Dictionary,QPDF_Stream,QPDF_Operator,QPDF_InlineImage,QPDF_Unresolved,QPDF_Destroyed,QPDF_Reference>
                              (&this->value);
      }
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
      pcVar2 = (pvVar4->name)._M_dataplus._M_p;
      std::__cxx11::string::_M_construct<char*>
                ((string *)__return_storage_ptr__,pcVar2,pcVar2 + (pvVar4->name)._M_string_length);
      return __return_storage_ptr__;
    }
    pvVar3 = std::
             get<15ul,std::monostate,QPDF_Reserved,QPDF_Null,QPDF_Bool,QPDF_Integer,QPDF_Real,QPDF_String,QPDF_Name,QPDF_Array,QPDF_Dictionary,QPDF_Stream,QPDF_Operator,QPDF_InlineImage,QPDF_Unresolved,QPDF_Destroyed,QPDF_Reference>
                       (&this->value);
    this = (pvVar3->obj).super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  } while( true );
}

Assistant:

std::string
QPDFObject::getStringValue() const
{
    switch (getResolvedTypeCode()) {
    case ::ot_real:
        return std::get<QPDF_Real>(value).val;
    case ::ot_string:
        return std::get<QPDF_String>(value).val;
    case ::ot_name:
        return std::get<QPDF_Name>(value).name;
    case ::ot_operator:
        return std::get<QPDF_Operator>(value).val;
    case ::ot_inlineimage:
        return std::get<QPDF_InlineImage>(value).val;
    case ::ot_reference:
        return std::get<QPDF_Reference>(value).obj->getStringValue();
    default:
        throw std::logic_error("Internal error in QPDFObject::getStringValue");
    }
    return ""; // unreachable
}